

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmemcontext.h
# Opt level: O3

void __thiscall
cookmem::SimpleMemContext<cookmem::MmapArena,cookmem::NoActionMemLogger,void>::~SimpleMemContext
          (SimpleMemContext<cookmem::MmapArena,cookmem::NoActionMemLogger,void> *this)

{
  size_t *psVar1;
  size_t *__addr;
  
  *(undefined ***)this = &PTR__MemContext_00105da0;
  __addr = *(size_t **)(this + 0x30);
  while (__addr != (size_t *)0x0) {
    psVar1 = (size_t *)__addr[1];
    munmap(__addr,*__addr);
    __addr = psVar1;
  }
  return;
}

Assistant:

virtual ~MemContext()
    {
    }